

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll-test.c
# Opt level: O2

void shutdown_behavior_impl(_func_void_int_ptr *fd_fun)

{
  FILE *__stream;
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  ssize_t sVar6;
  char *pcVar7;
  undefined8 uVar8;
  char c;
  int fds [3];
  socklen_t local_260;
  epoll_event event;
  epoll_event event_result;
  uint8_t data [512];
  
  iVar2 = epoll_create1(0x80000);
  if (iVar2 < 0) {
    pcVar7 = "ep >= 0";
    uVar8 = 0x601;
  }
  else {
    connector_epfd = iVar2;
    (*fd_fun)(fds);
    connector_epfd = -1;
    c = '*';
    write(fds[0],&c,1);
    event.events = 5;
    event.data.fd = fds[1];
    epoll_ctl(iVar2,1,fds[1],(epoll_event *)&event);
    piVar5 = __errno_location();
    *piVar5 = 0;
    iVar4 = 0;
    while (iVar3 = epoll_wait(iVar2,(epoll_event *)&event_result,1,-1), iVar3 == 1) {
      if (event_result.data.fd != fds[1]) {
        pcVar7 = "event_result.data.fd == fds[1]";
        uVar8 = 0x61a;
        goto LAB_00108aa3;
      }
      if ((event_result.events & 1) == 0) {
        if (event_result.events != 4) {
          if (((~event_result.events & 0x14) == 0 && fd_fun == fd_domain_socket) ||
             (event_result.events == 0x1c && fd_fun == fd_tcp_socket)) {
            data[0] = '\0';
            data[1] = '\0';
            data[2] = '\0';
            data[3] = '\0';
            local_260 = 4;
            getsockopt(event_result.data.fd,1,4,data,&local_260);
            uVar1 = data._0_4_;
            __stream = _stderr;
            pcVar7 = strerror(data._0_4_);
            fprintf(__stream,"socket error: %d (%s)\n",(ulong)(uint)uVar1,pcVar7);
          }
          else {
            if ((fd_fun != fd_tcp_socket) || (event_result.events != 0x14)) {
              microatf_fail_require
                        ("%s:%d: %p(%p/%p): events %x",
                         "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
                         ,0x660,fd_fun,fd_domain_socket,fd_tcp_socket,event_result.events);
            }
            fwrite("no socket error\n",0x10,1,_stderr);
          }
          iVar4 = close(fds[1]);
          if (iVar4 == 0) {
            if ((fds[2] == -1) || (iVar4 = close(fds[2]), iVar4 == 0)) {
              iVar2 = close(iVar2);
              if (iVar2 == 0) {
                return;
              }
              pcVar7 = "close(ep) == 0";
              uVar8 = 0x666;
            }
            else {
              pcVar7 = "fds[2] == -1 || close(fds[2]) == 0";
              uVar8 = 0x665;
            }
          }
          else {
            pcVar7 = "close(fds[1]) == 0";
            uVar8 = 0x664;
          }
          goto LAB_00108aa3;
        }
        send(event.data.fd,&c,1,0x4000);
      }
      else {
        sVar6 = read(event_result.data.fd,&c,1);
        if ((int)sVar6 != 1) {
          pcVar7 = "(n = (int)read(fds[1], &c, 1)) == 1";
          uVar8 = 0x621;
          goto LAB_00108aa3;
        }
        iVar3 = iVar4 + 1;
        if (iVar4 < 5) {
          send(fds[0],&c,1,0x4000);
          iVar4 = iVar3;
        }
        else if (iVar3 == 6) {
          send(fds[0],&c,1,0x4000);
          shutdown(fds[0],1);
          usleep(100000);
          iVar4 = 6;
        }
        else {
          memset(data,0,0x200);
          send(fds[1],data,0x200,0x4000);
          close(fds[0]);
          event.events = 4;
          event.data.fd = fds[1];
          iVar4 = epoll_ctl(iVar2,3,fds[1],(epoll_event *)&event);
          if (iVar4 != 0) {
            pcVar7 = "epoll_ctl(ep, EPOLL_CTL_MOD, fds[1], &event) == 0";
            uVar8 = 0x635;
            goto LAB_00108aa3;
          }
          usleep(100000);
          iVar4 = iVar3;
        }
      }
    }
    pcVar7 = "(n = epoll_wait(ep, &event_result, 1, -1)) == 1";
    uVar8 = 0x618;
  }
LAB_00108aa3:
  microatf_fail_require
            ("%s:%d: %s not met",
             "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
             ,uVar8,pcVar7);
}

Assistant:

static void
shutdown_behavior_impl(void (*fd_fun)(int fds[3]))
{
	int ep = epoll_create1(EPOLL_CLOEXEC);
	ATF_REQUIRE(ep >= 0);

	connector_epfd = ep;

	int fds[3];
	fd_fun(fds);

	connector_epfd = -1;

	int counter = 0;
	char c = 42;
	write(fds[0], &c, 1);

	struct epoll_event event;
	event.events = EPOLLOUT | EPOLLIN;
	event.data.fd = fds[1];
	epoll_ctl(ep, EPOLL_CTL_ADD, fds[1], &event);

	errno = 0;

	for (;;) {
		struct epoll_event event_result;
		int n;
		ATF_REQUIRE((n = epoll_wait(ep, &event_result, 1, -1)) == 1);

		ATF_REQUIRE(event_result.data.fd == fds[1]);

		// fprintf(stderr, "got event: %x %d\n",
		// (int)event_result.events,
		//     (int)event_result.events);

		if (event_result.events & EPOLLIN) {
			ATF_REQUIRE((n = (int)read(fds[1], &c, 1)) == 1);

			++counter;

			if (counter <= 5) {
				send(fds[0], &c, 1, MSG_NOSIGNAL);
			} else if (counter == 6) {
				send(fds[0], &c, 1, MSG_NOSIGNAL);
				shutdown(fds[0], SHUT_WR);

				usleep(100000);
			} else {
				uint8_t data[512] = { 0 };
				send(fds[1], &data, sizeof(data), MSG_NOSIGNAL);

				close(fds[0]);

				event.events = EPOLLOUT;
				event.data.fd = fds[1];
				ATF_REQUIRE(epoll_ctl(ep, EPOLL_CTL_MOD, /**/
						fds[1], &event) == 0);

				usleep(100000);
			}

		} else if (event_result.events == EPOLLOUT) {
			send(event.data.fd, &c, 1, MSG_NOSIGNAL);
			// continue
		} else if (fd_fun == fd_domain_socket &&
		    (event_result.events & (EPOLLOUT | EPOLLHUP)) ==
			(EPOLLOUT | EPOLLHUP)) {
			// TODO(jan): Linux sets EPOLLERR in addition
			{
				int error = 0;
				socklen_t errlen = sizeof(error);
				getsockopt(fds[1], SOL_SOCKET, SO_ERROR,
				    (void *)&error, &errlen);
				fprintf(stderr, "socket error: %d (%s)\n",
				    error, strerror(error));
			}
			break;
		} else if (fd_fun == fd_tcp_socket &&
		    event_result.events == (EPOLLOUT | EPOLLERR | EPOLLHUP)) {
			{
				int error = 0;
				socklen_t errlen = sizeof(error);
				getsockopt(fds[1], SOL_SOCKET, SO_ERROR,
				    (void *)&error, &errlen);
				fprintf(stderr, "socket error: %d (%s)\n",
				    error, strerror(error));
			}
			break;
		} else if (fd_fun == fd_tcp_socket &&
		    event_result.events == (EPOLLOUT | EPOLLHUP)) {
			/*
			 * Rarely, we get here (no EPOLLERR). But don't fail
			 * the test. There is some non-determinism involved...
			 */
			fprintf(stderr, "no socket error\n");
			break;
		} else {
			ATF_REQUIRE_MSG(false, "%p(%p/%p): events %x",
			    (void *)fd_fun, (void *)fd_domain_socket,
			    (void *)fd_tcp_socket, event_result.events);
		}
	}

	ATF_REQUIRE(close(fds[1]) == 0);
	ATF_REQUIRE(fds[2] == -1 || close(fds[2]) == 0);
	ATF_REQUIRE(close(ep) == 0);
}